

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

void __thiscall re2::BitState::BitState(BitState *this,Prog *prog)

{
  this->prog_ = prog;
  (this->text_).ptr_ = (char *)0x0;
  (this->text_).length_ = 0;
  (this->context_).ptr_ = (char *)0x0;
  (this->context_).length_ = 0;
  this->anchored_ = false;
  this->longest_ = false;
  this->endmatch_ = false;
  this->submatch_ = (StringPiece *)0x0;
  this->nsubmatch_ = 0;
  this->cap_ = (char **)0x0;
  this->ncap_ = 0;
  this->visited_ = (uint32 *)0x0;
  this->nvisited_ = 0;
  this->job_ = (Job *)0x0;
  this->njob_ = 0;
  this->maxjob_ = 0;
  return;
}

Assistant:

BitState::BitState(Prog* prog)
  : prog_(prog),
    anchored_(false),
    longest_(false),
    endmatch_(false),
    submatch_(NULL),
    nsubmatch_(0),
    cap_(NULL),
    ncap_(0),
    visited_(NULL),
    nvisited_(0),
    job_(NULL),
    njob_(0),
    maxjob_(0) {
}